

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::Surface::Surface(Surface *this,SharedPtr<tcu::ThreadUtil::Event> *event)

{
  SharedPtr<tcu::ThreadUtil::Event> local_18;
  
  local_18.m_ptr = event->m_ptr;
  local_18.m_state = event->m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Object::Object(&this->super_Object,"Surface",&local_18);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_18);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Surface_003d5c30;
  this->surface = (EGLSurface)0x0;
  return;
}

Assistant:

Surface::Surface (SharedPtr<tcu::ThreadUtil::Event> event)
	: tcu::ThreadUtil::Object	("Surface", event)
	, surface					(EGL_NO_SURFACE)
{
}